

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

void kratos::topological_sort_helper
               (GeneratorGraph *g,GeneratorNode *node,
               unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
               *visited,queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                        *queue)

{
  _Base_ptr *pp_Var1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  GeneratorNode *local_48;
  GeneratorNode *node_local;
  GeneratorNode *child_node;
  
  local_48 = node;
  child_node = (GeneratorNode *)queue;
  std::
  _Hashtable<kratos::GeneratorNode*,kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>,std::__detail::_Identity,std::equal_to<kratos::GeneratorNode*>,std::hash<kratos::GeneratorNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<kratos::GeneratorNode*&>
            ((_Hashtable<kratos::GeneratorNode*,kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>,std::__detail::_Identity,std::equal_to<kratos::GeneratorNode*>,std::hash<kratos::GeneratorNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_48);
  p_Var3 = (local_48->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(local_48->children)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      node_local = GeneratorGraph::get_node(g,*(Generator **)(p_Var3 + 1));
      iVar2 = std::
              _Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&visited->_M_h,&node_local);
      if (iVar2.super__Node_iterator_base<kratos::GeneratorNode_*,_false>._M_cur ==
          (__node_type *)0x0) {
        topological_sort_helper
                  (g,node_local,visited,
                   (queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                    *)child_node);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  p_Var3 = (child_node->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  if (p_Var3 == (_Base_ptr)
                &child_node[1].parent[-1].children._M_t._M_impl.super__Rb_tree_header._M_node_count)
  {
    std::deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>>::
    _M_push_back_aux<kratos::GeneratorNode*const&>
              ((deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>> *)child_node,
               &local_48);
  }
  else {
    *(GeneratorNode **)p_Var3 = local_48;
    pp_Var1 = &(child_node->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    *pp_Var1 = (_Base_ptr)&(*pp_Var1)->_M_parent;
  }
  return;
}

Assistant:

void topological_sort_helper(GeneratorGraph *g, GeneratorNode *node,
                             std::unordered_set<GeneratorNode *> &visited,
                             std::queue<GeneratorNode *> &queue) {
    // mark it as visited
    visited.emplace(node);

    // visit all the child node
    for (auto const &child : node->children) {
        auto *child_node = g->get_node(child);
        if (visited.find(child_node) == visited.end()) {
            // visit it
            topological_sort_helper(g, child_node, visited, queue);
        }
    }
    queue.push(node);
}